

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLookupResultValid
               (Texture2DView *texture,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  float __x;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  FilterMode FVar5;
  int iVar6;
  int iVar7;
  float fVar8;
  float fVar9;
  Vec2 local_38;
  
  fVar9 = lodBounds->m_data[0];
  __x = lodBounds->m_data[1];
  fVar8 = sampler->lodThreshold;
  if ((fVar9 <= fVar8) &&
     (bVar1 = isLevelSampleResultValid
                        (texture->m_levels,sampler,sampler->magFilter,prec,coord,0,result), bVar1))
  {
    return true;
  }
  if (__x <= fVar8) {
    return false;
  }
  FVar5 = sampler->minFilter;
  iVar6 = texture->m_numLevels;
  iVar7 = iVar6 + -1;
  if (iVar7 < 1 || (FVar5 - NEAREST_MIPMAP_LINEAR & 0xfffffffd) != 0) {
    if ((FVar5 == LINEAR_MIPMAP_NEAREST) || (FVar5 == NEAREST_MIPMAP_NEAREST)) {
      fVar9 = ceilf(fVar9 + 0.5);
      iVar3 = (int)fVar9 + -1;
      iVar6 = iVar7;
      if (iVar3 < iVar7) {
        iVar6 = iVar3;
      }
      if (iVar3 < 0) {
        iVar6 = 0;
      }
      fVar9 = floorf(__x + 0.5);
      iVar3 = (int)fVar9;
      if (iVar3 < iVar7) {
        iVar7 = iVar3;
      }
      if (iVar3 < 0) {
        iVar7 = 0;
      }
      for (; iVar6 <= iVar7; iVar6 = iVar6 + 1) {
        uVar4 = sampler->minFilter - LINEAR;
        FVar5 = NEAREST;
        if (uVar4 < 5) {
          FVar5 = *(FilterMode *)(&DAT_00a06398 + (ulong)uVar4 * 4);
        }
        bVar1 = isLevelSampleResultValid
                          (texture->m_levels + iVar6,sampler,FVar5,prec,coord,0,result);
        if (bVar1) {
          bVar1 = true;
          goto LAB_0091c1ce;
        }
      }
      bVar1 = false;
LAB_0091c1ce:
      if (iVar6 <= iVar7) goto LAB_0091c186;
    }
    else {
      bVar2 = isLevelSampleResultValid(texture->m_levels,sampler,FVar5,prec,coord,0,result);
      bVar1 = true;
      if (bVar2) goto LAB_0091c186;
    }
  }
  else {
    fVar8 = floorf(fVar9);
    iVar3 = (int)fVar8;
    iVar6 = iVar6 + -2;
    iVar7 = iVar6;
    if (iVar3 < iVar6) {
      iVar7 = iVar3;
    }
    if (iVar3 < 0) {
      iVar7 = 0;
    }
    fVar8 = floorf(__x);
    iVar3 = (int)fVar8;
    if (iVar3 < iVar6) {
      iVar6 = iVar3;
    }
    if (iVar3 < 0) {
      iVar6 = 0;
    }
    do {
      iVar3 = iVar7;
      if (iVar6 < iVar3) {
        bVar1 = false;
        goto LAB_0091c180;
      }
      uVar4 = sampler->minFilter - LINEAR;
      FVar5 = NEAREST;
      if (uVar4 < 5) {
        FVar5 = *(FilterMode *)(&DAT_00a06398 + (ulong)uVar4 * 4);
      }
      fVar8 = fVar9 - (float)iVar3;
      local_38.m_data[0] = 1.0;
      if (fVar8 <= 1.0) {
        local_38.m_data[0] = fVar8;
      }
      local_38.m_data[0] = (float)(~-(uint)(fVar8 < 0.0) & (uint)local_38.m_data[0]);
      fVar8 = __x - (float)iVar3;
      local_38.m_data[1] = 1.0;
      if (fVar8 <= 1.0) {
        local_38.m_data[1] = fVar8;
      }
      local_38.m_data[1] = (float)(~-(uint)(fVar8 < 0.0) & (uint)local_38.m_data[1]);
      bVar1 = isMipmapLinearSampleResultValid
                        (texture->m_levels + iVar3,texture->m_levels + (iVar3 + 1),sampler,FVar5,
                         prec,coord,0,&local_38,result);
      iVar7 = iVar3 + 1;
    } while (!bVar1);
    bVar1 = true;
LAB_0091c180:
    if (iVar3 <= iVar6) goto LAB_0091c186;
  }
  bVar1 = false;
LAB_0091c186:
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool isLookupResultValid (const Texture2DView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec2& coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, 0, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, 0, result))
				return true;
		}
	}

	return false;
}